

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

string * __thiscall
fasttext::Args::lossToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,loss_name ln)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (ln == softmax) {
    pcVar2 = "softmax";
    pcVar1 = "";
  }
  else if (ln == ns) {
    pcVar2 = "ns";
    pcVar1 = "";
  }
  else if (ln == hs) {
    pcVar2 = "hs";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown loss!";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::lossToString(loss_name ln) const {
  switch (ln) {
    case loss_name::hs:
      return "hs";
    case loss_name::ns:
      return "ns";
    case loss_name::softmax:
      return "softmax";
  }
  return "Unknown loss!"; // should never happen
}